

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakWarningLocalDetectorTest_localDetectorIsGlobalDetector_Test::testBody
          (TEST_MemoryLeakWarningLocalDetectorTest_localDetectorIsGlobalDetector_Test *this)

{
  MemoryLeakDetector *pMVar1;
  MemoryLeakDetector *pMVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  MemoryLeakWarningPlugin memoryLeakWarningPlugin;
  SimpleString local_70;
  MemoryLeakWarningPlugin local_60;
  
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  SimpleString::SimpleString(&local_70,"TestMemoryLeakWarningPlugin");
  MemoryLeakWarningPlugin::MemoryLeakWarningPlugin(&local_60,&local_70,(MemoryLeakDetector *)0x0);
  SimpleString::~SimpleString(&local_70);
  pMVar2 = MemoryLeakWarningPlugin::getMemoryLeakDetector(&local_60);
  pUVar3 = UtestShell::getCurrent();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,pMVar1,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x3e,pTVar4);
  MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(&local_60);
  return;
}

Assistant:

TEST(MemoryLeakWarningLocalDetectorTest, localDetectorIsGlobalDetector)
{
    MemoryLeakDetector* globalDetector = MemoryLeakWarningPlugin::getGlobalDetector();
    MemoryLeakWarningPlugin memoryLeakWarningPlugin("TestMemoryLeakWarningPlugin", NULLPTR);
    MemoryLeakDetector* localDetector =  memoryLeakWarningPlugin.getMemoryLeakDetector();
    POINTERS_EQUAL(globalDetector, localDetector);
}